

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

void __thiscall
density::heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
const_iterator::const_iterator
          (const_iterator *this,
          heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          *i_queue,ControlBlock *i_control)

{
  runtime_type<> *i_target_type;
  void *i_target_address;
  runtime_type<> *type;
  ControlBlock *i_control_local;
  heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *i_queue_local;
  const_iterator *this_local;
  
  this->m_control = i_control;
  this->m_queue = i_queue;
  Value::Value((Value *)&(this->m_value).m_pair);
  if (this->m_control != (ControlBlock *)0x0) {
    i_target_type =
         heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
         type_after_control(this->m_control);
    i_target_address =
         heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
         get_element(this->m_control);
    dynamic_reference<density::runtime_type<>,_(density::cv_qual)1>::dynamic_reference
              (&(this->m_value).m_pair,i_target_type,i_target_address);
  }
  return;
}

Assistant:

const_iterator(const heter_queue * i_queue, ControlBlock * i_control) noexcept
                : m_control(i_control), m_queue(i_queue)
            {
                if (m_control != nullptr)
                {
                    const RUNTIME_TYPE & type = *type_after_control(m_control);
                    new (&m_value.m_pair) value_type(type, get_element(m_control));
                }
            }